

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

bool __thiscall
cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::MatchesCondition>::operator()
          (Object<cmCMakePresetsGraphInternal::MatchesCondition> *this,MatchesCondition *out,
          Value *value,cmJSONState *state)

{
  pointer pMVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  Value *__args_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  pointer pMVar5;
  Members extraFields;
  string name;
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_50;
  
  extraFields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extraFields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extraFields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (value == (Value *)0x0) {
    if (this->AnyRequired != true) goto LAB_00294c94;
    std::
    function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::operator()((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&name,&this->Error,
                 RequiredMissing,&extraFields);
    std::function<void_(const_Json::Value_*,_cmJSONState_*)>::operator()
              ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&name,(Value *)0x0,state);
  }
  else {
    bVar3 = Json::Value::isObject(value);
    if (bVar3) {
      Json::Value::getMemberNames_abi_cxx11_((Members *)&name,value);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&extraFields,&name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&name);
LAB_00294c94:
      pMVar1 = (this->Members).
               super__Vector_base<cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::MatchesCondition>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::MatchesCondition>::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = true;
      for (pMVar5 = (this->Members).
                    super__Vector_base<cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::MatchesCondition>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::MatchesCondition>::Member>_>
                    ._M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar1; pMVar5 = pMVar5 + 1
          ) {
        pcVar2 = (pMVar5->Name)._M_str;
        name._M_dataplus._M_p = (pointer)&name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&name,pcVar2,pcVar2 + (pMVar5->Name)._M_len);
        cmJSONState::push_stack(state,&name,value);
        if (value == (Value *)0x0) {
LAB_00294d46:
          if (pMVar5->Required == false) {
            bVar4 = std::
                    function<bool_(cmCMakePresetsGraphInternal::MatchesCondition_&,_const_Json::Value_*,_cmJSONState_*)>
                    ::operator()(&pMVar5->Function,out,(Value *)0x0,state);
            bVar3 = (bool)(bVar3 & bVar4);
          }
          else {
            std::
            function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
            ::operator()(&local_50,&this->Error,MissingRequired,&extraFields);
            std::function<void_(const_Json::Value_*,_cmJSONState_*)>::operator()
                      (&local_50,value,state);
            std::_Function_base::~_Function_base(&local_50.super__Function_base);
            bVar3 = false;
          }
        }
        else {
          bVar4 = Json::Value::isMember(value,&name);
          if (!bVar4) goto LAB_00294d46;
          __args_1 = Json::Value::operator[](value,&name);
          bVar4 = std::
                  function<bool_(cmCMakePresetsGraphInternal::MatchesCondition_&,_const_Json::Value_*,_cmJSONState_*)>
                  ::operator()(&pMVar5->Function,out,__args_1,state);
          __position = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (extraFields.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  extraFields.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&name);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&extraFields,(const_iterator)__position._M_current);
          bVar3 = (bool)(bVar3 & bVar4);
        }
        cmJSONState::pop_stack(state);
        std::__cxx11::string::~string((string *)&name);
      }
      if ((this->AllowExtra != false) ||
         (extraFields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          extraFields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_00294e20;
      std::
      function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
      ::operator()((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&name,&this->Error,
                   ExtraField,&extraFields);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::operator()
                ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&name,value,state);
    }
    else {
      std::
      function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
      ::operator()((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&name,&this->Error,
                   InvalidObject,&extraFields);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::operator()
                ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&name,value,state);
    }
  }
  std::_Function_base::~_Function_base((_Function_base *)&name);
  bVar3 = false;
LAB_00294e20:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&extraFields);
  return bVar3;
}

Assistant:

bool operator()(T& out, const Json::Value* value, cmJSONState* state) const
    {
      Json::Value::Members extraFields;
      bool success = true;
      if (!value && this->AnyRequired) {
        Error(JsonErrors::ObjectError::RequiredMissing, extraFields)(value,
                                                                     state);
        return false;
      }
      if (value && !value->isObject()) {
        Error(JsonErrors::ObjectError::InvalidObject, extraFields)(value,
                                                                   state);
        return false;
      }
      if (value) {
        extraFields = value->getMemberNames();
      }

      for (auto const& m : this->Members) {
        std::string name(m.Name.data(), m.Name.size());
        state->push_stack(name, value);
        if (value && value->isMember(name)) {
          if (!m.Function(out, &(*value)[name], state)) {
            success = false;
          }
          extraFields.erase(
            std::find(extraFields.begin(), extraFields.end(), name));
        } else if (!m.Required) {
          if (!m.Function(out, nullptr, state)) {
            success = false;
          }
        } else {
          Error(JsonErrors::ObjectError::MissingRequired, extraFields)(value,
                                                                       state);
          success = false;
        }
        state->pop_stack();
      }

      if (!this->AllowExtra && !extraFields.empty()) {
        Error(JsonErrors::ObjectError::ExtraField, extraFields)(value, state);
        success = false;
      }
      return success;
    }